

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall
HashCallback<unsigned_long>::operator()(HashCallback<unsigned_long> *this,void *key,int len)

{
  size_type sVar1;
  reference pvVar2;
  undefined4 in_EDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  unsigned_long h;
  size_t newsize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_28;
  long local_20;
  undefined4 in_stack_ffffffffffffffe8;
  
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    (*(vector<unsigned_long,_std::allocator<unsigned_long>_> **)(in_RDI + 0x10));
  local_20 = sVar1 + 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  (**(code **)(in_RDI + 0x18))(in_RSI,in_EDX,0,&local_28);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(local_28);
  *pvVar2 = (value_type)local_28;
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    size_t newsize = m_hashes.size() + 1;

    m_hashes.resize(newsize);

    hashtype h;
    m_pfHash(key, len, 0, &h);

    m_hashes.back() = h;
  }